

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *__s1;
  uchar *__s2;
  sbyte sVar5;
  ushort uVar6;
  ushort uVar7;
  int iVal;
  sqlite3_value *local_50;
  sqlite3_value *local_48;
  
  uVar7 = (*argv)->flags & 0x3f;
  uVar6 = argv[1]->flags & 0x3f;
  sVar5 = (sbyte)uVar6;
  if ((((uint)(0xaaaaaaaaaaaaaaaa >> sVar5) | (uint)(0xaaaaaaaaaaaaaaaa >> (sbyte)uVar7)) & 1) != 0)
  {
    return;
  }
  iVar2 = sqlite3_value_bytes(*argv);
  iVar3 = sqlite3_value_bytes(argv[1]);
  if (iVar3 < 1) {
    iVal = 1;
    local_48 = (sqlite3_value *)0x0;
    local_50 = (sqlite3_value *)0x0;
LAB_001b9470:
    sqlite3_result_int(context,iVal);
    goto LAB_001b947b;
  }
  if (((byte)(0x1000000010001 >> sVar5) & (0x1000000010001U >> uVar7 & 1) != 0) == 1) {
    __s1 = (uchar *)sqlite3_value_blob(*argv);
    __s2 = (uchar *)sqlite3_value_blob(argv[1]);
LAB_001b9352:
    if (__s2 == (uchar *)0x0) {
      local_48 = (sqlite3_value *)0x0;
      goto LAB_001b93d5;
    }
    local_48 = (sqlite3_value *)0x0;
    if (iVar2 == 0 || __s1 != (uchar *)0x0) {
      local_50 = (sqlite3_value *)0x0;
LAB_001b93ef:
      uVar1 = *__s2;
      iVal = 1;
      for (; iVar3 <= iVar2; iVar2 = iVar2 + -1) {
        if ((*__s1 == uVar1) && (iVar4 = bcmp(__s1,__s2,(long)iVar3), iVar4 == 0))
        goto LAB_001b9470;
        iVal = iVal + 1;
        __s1 = __s1 + 1;
      }
      iVal = 0;
      goto LAB_001b9470;
    }
    local_50 = (sqlite3_value *)0x0;
    local_48 = (sqlite3_value *)0x0;
  }
  else {
    if (((0xfffefffffffefffeU >> uVar7 & 1) != 0) && ((0xfffefffffffefffeU >> uVar6 & 1) != 0)) {
      __s1 = sqlite3_value_text(*argv);
      __s2 = sqlite3_value_text(argv[1]);
      goto LAB_001b9352;
    }
    local_48 = sqlite3_value_dup(*argv);
    __s1 = sqlite3_value_text(local_48);
    if (__s1 != (uchar *)0x0) {
      iVar2 = sqlite3_value_bytes(local_48);
      local_50 = sqlite3_value_dup(argv[1]);
      __s2 = sqlite3_value_text(local_50);
      if (__s2 != (uchar *)0x0) {
        iVar3 = sqlite3_value_bytes(local_50);
        goto LAB_001b93ef;
      }
      goto LAB_001b93d7;
    }
LAB_001b93d5:
    local_50 = (sqlite3_value *)0x0;
  }
LAB_001b93d7:
  sqlite3_result_error_nomem(context);
LAB_001b947b:
  sqlite3ValueFree(local_48);
  sqlite3ValueFree(local_50);
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;
  sqlite3_value *pC1 = 0;
  sqlite3_value *pC2 = 0;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else if( typeHaystack!=SQLITE_BLOB && typeNeedle!=SQLITE_BLOB ){
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }else{
      pC1 = sqlite3_value_dup(argv[0]);
      zHaystack = sqlite3_value_text(pC1);
      if( zHaystack==0 ) goto endInstrOOM;
      nHaystack = sqlite3_value_bytes(pC1);
      pC2 = sqlite3_value_dup(argv[1]);
      zNeedle = sqlite3_value_text(pC2);
      if( zNeedle==0 ) goto endInstrOOM;
      nNeedle = sqlite3_value_bytes(pC2);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) goto endInstrOOM;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
endInstr:
  sqlite3_value_free(pC1);
  sqlite3_value_free(pC2);
  return;
endInstrOOM:
  sqlite3_result_error_nomem(context);
  goto endInstr;
}